

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O3

void __thiscall IZDeflate::set_file_type(IZDeflate *this)

{
  ulong uVar1;
  ush *puVar2;
  long lVar3;
  
  uVar1 = 0xf3ffc07f;
  lVar3 = 0;
  while (((uVar1 & 1) == 0 || (this->dyn_ltree[lVar3].fc.freq == 0))) {
    lVar3 = lVar3 + 1;
    uVar1 = uVar1 >> 1;
    if (lVar3 == 0x20) {
      puVar2 = this->file_type;
      *puVar2 = 1;
      if (((this->dyn_ltree[9].fc.freq == 0) && (this->dyn_ltree[10].fc.freq == 0)) &&
         (this->dyn_ltree[0xd].fc.freq == 0)) {
        lVar3 = 0;
        do {
          if (this->dyn_ltree[lVar3 + 0x20].fc.freq != 0) {
            return;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0xe0);
LAB_00179e5c:
        *puVar2 = 0;
      }
      return;
    }
  }
  puVar2 = this->file_type;
  goto LAB_00179e5c;
}

Assistant:

void IZDeflate::set_file_type()
{
    /* bit-mask of black-listed bytes
     * bit is set if byte is black-listed
     * set bits 0..6, 14..25, and 28..31
     * 0xf3ffc07f = binary 11110011111111111100000001111111
     */
    unsigned long mask = 0xf3ffc07fL;
    int n;

    /* Check for non-textual ("black-listed") bytes. */
    for (n = 0; n <= 31; n++, mask >>= 1)
        if ((mask & 1) && (dyn_ltree[n].Freq != 0))
        {
            *file_type = BINARY;
            return;
        }

    /* Check for textual ("white-listed") bytes. */
    *file_type = ASCII;
    if (dyn_ltree[9].Freq != 0 || dyn_ltree[10].Freq != 0
            || dyn_ltree[13].Freq != 0)
        return;
    for (n = 32; n < LITERALS; n++)
        if (dyn_ltree[n].Freq != 0)
            return;

    /* This deflate stream is either empty, or
     * it has tolerated ("gray-listed") bytes only.
     */
    *file_type = BINARY;
}